

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

bool __thiscall
ON_Font::Internal_SetFontWeightTrio
          (ON_Font *this,Weight font_weight,int windows_logfont_weight,
          double apple_font_weight_trait,bool bUpdateFontDescription)

{
  Weight WVar1;
  bool bVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  int iVar4;
  
  uVar3 = (uint)CONCAT71(in_register_00000031,font_weight);
  if (uVar3 == 0) {
    if (windows_logfont_weight - 1U < 1000) {
      WVar1 = WeightFromWindowsLogfontWeight(windows_logfont_weight);
    }
    else {
      if (1.0 < ABS(apple_font_weight_trait)) {
        uVar3 = 0;
        goto LAB_004882df;
      }
      WVar1 = WeightFromAppleFontWeightTrait(apple_font_weight_trait);
    }
    uVar3 = (uint)WVar1;
  }
LAB_004882df:
  WVar1 = FontWeightFromUnsigned(uVar3 & 0xff);
  if (WVar1 != Unset) {
    iVar4 = 900;
    if (WVar1 < Heavy) {
      iVar4 = (uint)WVar1 * 100;
    }
    if (0xfffffc17 < windows_logfont_weight - 0x3e9U) {
      iVar4 = windows_logfont_weight;
    }
    if (1.0 < ABS(apple_font_weight_trait)) {
      apple_font_weight_trait = AppleFontWeightTraitFromWeight(WVar1);
    }
    if (WVar1 == this->m_font_weight) {
      if (((apple_font_weight_trait == this->m_apple_font_weight_trait) &&
          (!NAN(apple_font_weight_trait) && !NAN(this->m_apple_font_weight_trait))) &&
         (iVar4 == this->m_windows_logfont_weight)) {
        return true;
      }
    }
    bVar2 = ModificationPermitted
                      (this,"",
                       "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                       ,0x2dfd);
    if (bVar2) {
      if (WVar1 != this->m_font_weight) {
        this->m_font_weight = WVar1;
      }
      if ((apple_font_weight_trait != this->m_apple_font_weight_trait) ||
         (NAN(apple_font_weight_trait) || NAN(this->m_apple_font_weight_trait))) {
        this->m_apple_font_weight_trait = apple_font_weight_trait;
      }
      if (iVar4 != this->m_windows_logfont_weight) {
        this->m_windows_logfont_weight = iVar4;
      }
      Internal_AfterModification(this);
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Font::Internal_SetFontWeightTrio(
  ON_Font::Weight font_weight,
  int windows_logfont_weight,
  double apple_font_weight_trait,
  bool bUpdateFontDescription
)
{
  if (ON_Font::Weight::Unset == font_weight)
  {
    if (windows_logfont_weight > 0 && windows_logfont_weight <= 1000)
    {
      font_weight = ON_Font::WeightFromWindowsLogfontWeight(windows_logfont_weight);
    }
    else if (-1.0 <= apple_font_weight_trait && apple_font_weight_trait <= 1.0)
    {
      font_weight = ON_Font::WeightFromAppleFontWeightTrait(apple_font_weight_trait);
    }
  }

  font_weight = ON_Font::FontWeightFromUnsigned((unsigned int)static_cast<unsigned char>(font_weight));
  if (ON_Font::Weight::Unset == font_weight)
    return false;

  if (false == (1 <= windows_logfont_weight && windows_logfont_weight <= 1000))
    windows_logfont_weight = ON_Font::WindowsLogfontWeightFromWeight(font_weight);

  if (false == (-1.0 <= apple_font_weight_trait && apple_font_weight_trait <= 1.0) )
    apple_font_weight_trait = ON_Font::AppleFontWeightTraitFromWeight(font_weight);
  
  if ( 
    font_weight != m_font_weight
    || false == (apple_font_weight_trait == m_apple_font_weight_trait) // handles nans correctly
    || windows_logfont_weight != m_windows_logfont_weight
    )
  {
    if (false == ON_FONT_MODIFICATION_PERMITTED)
      return false;
    
    if (font_weight != m_font_weight)
    {
      m_font_weight = font_weight;
    }

    if (false == (apple_font_weight_trait == m_apple_font_weight_trait))
      m_apple_font_weight_trait = apple_font_weight_trait;

    if (windows_logfont_weight != m_windows_logfont_weight)
      m_windows_logfont_weight = windows_logfont_weight;

    Internal_AfterModification();
  }

  return true;
}